

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool AddLocal(CService *addr_,int nScore)

{
  long lVar1;
  bool bVar2;
  uint16_t uVar3;
  _Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_> _Var4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<std::_Rb_tree_iterator<std::pair<const_CNetAddr,_LocalServiceInfo>_>,_bool> pVar5;
  LocalServiceInfo local_70;
  int nScore_local;
  UniqueLock<GlobalMutex> criticalblock19;
  CService addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nScore_local = nScore;
  MaybeFlipIPv6toCJDNS(&addr,addr_);
  bVar2 = CNetAddr::IsRoutable(&addr.super_CNetAddr);
  if ((bVar2) && ((3 < nScore || (fDiscover != false)))) {
    bVar2 = ReachableNets::Contains(&g_reachable_nets,&addr.super_CNetAddr);
    if (bVar2) {
      CService::ToStringAddrPort_abi_cxx11_((string *)&criticalblock19,&addr);
      logging_function._M_str = "AddLocal";
      logging_function._M_len = 8;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<std::__cxx11::string,int>
                (logging_function,source_file,0x119,ALL,Info,(ConstevalFormatString<2U>)0x686e49,
                 (string *)&criticalblock19,&nScore_local);
      std::__cxx11::string::~string((string *)&criticalblock19);
      UniqueLock<GlobalMutex>::UniqueLock
                (&criticalblock19,&g_maplocalhost_mutex,"g_maplocalhost_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                 ,0x11c,false);
      local_70.nScore = 0;
      local_70.nPort = 0;
      local_70._6_2_ = 0;
      pVar5 = std::
              _Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
              ::_M_emplace_unique<CService&,LocalServiceInfo>
                        ((_Rb_tree<CNetAddr,std::pair<CNetAddr_const,LocalServiceInfo>,std::_Select1st<std::pair<CNetAddr_const,LocalServiceInfo>>,std::less<CNetAddr>,std::allocator<std::pair<CNetAddr_const,LocalServiceInfo>>>
                          *)&mapLocalHost,&addr,&local_70);
      _Var4 = pVar5.first._M_node;
      if ((((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         ((int)_Var4._M_node[2]._M_color <= nScore_local)) {
        _Var4._M_node[2]._M_color = nScore_local + (uint)(byte)(pVar5.second ^ 1);
        uVar3 = CService::GetPort(&addr);
        *(uint16_t *)&_Var4._M_node[2].field_0x4 = uVar3;
      }
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock19.super_unique_lock);
      bVar2 = true;
      goto LAB_001752dd;
    }
  }
  bVar2 = false;
LAB_001752dd:
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool AddLocal(const CService& addr_, int nScore)
{
    CService addr{MaybeFlipIPv6toCJDNS(addr_)};

    if (!addr.IsRoutable())
        return false;

    if (!fDiscover && nScore < LOCAL_MANUAL)
        return false;

    if (!g_reachable_nets.Contains(addr))
        return false;

    LogPrintf("AddLocal(%s,%i)\n", addr.ToStringAddrPort(), nScore);

    {
        LOCK(g_maplocalhost_mutex);
        const auto [it, is_newly_added] = mapLocalHost.emplace(addr, LocalServiceInfo());
        LocalServiceInfo &info = it->second;
        if (is_newly_added || nScore >= info.nScore) {
            info.nScore = nScore + (is_newly_added ? 0 : 1);
            info.nPort = addr.GetPort();
        }
    }

    return true;
}